

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bwtil::cgap_dictionary::bitvector_to_gaps(vector<bool,_std::allocator<bool>_> *B)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  reference rVar4;
  ulint i;
  ulint gap_len;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *gaps;
  value_type *in_stack_ffffffffffffff58;
  value_type *in_stack_ffffffffffffff68;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff70;
  _Bit_type in_stack_ffffffffffffff78;
  _Bit_type *in_stack_ffffffffffffff80;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffa0;
  reference local_58 [2];
  reference local_38;
  ulong local_28;
  undefined1 local_19;
  long local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  local_18 = 1;
  local_19 = 0;
  local_10 = in_RSI;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x12577d);
  rVar4._M_mask = in_stack_ffffffffffffff78;
  rVar4._M_p = in_stack_ffffffffffffff80;
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffa0);
    if (sVar3 <= uVar1) break;
    rVar4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)rVar4._M_p,rVar4._M_mask);
    local_38 = rVar4;
    bVar2 = ::std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (bVar2) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      local_18 = 1;
    }
    else {
      local_18 = local_18 + 1;
    }
    local_28 = local_28 + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::size(in_stack_ffffffffffffffa0);
  local_58[0] = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)rVar4._M_p,rVar4._M_mask);
  bVar2 = ::std::_Bit_reference::operator_cast_to_bool(local_58);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (local_10,in_stack_ffffffffffffff58);
  }
  return in_RDI;
}

Assistant:

static vector<ulint> bitvector_to_gaps(vector<bool> &B){

		ulint gap_len=1;
		vector<ulint> gaps;

		for(ulint i=0;i<B.size();++i){

			if(B[i]){

				gaps.push_back(gap_len);
				gap_len=1;

			}else{
				gap_len++;
			}

		}

		if(not B[B.size()-1])
			gaps.push_back(gap_len-1);

		assert(gaps.size()>0);

		return gaps;

	}